

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall sznet::net::Buffer::Buffer(Buffer *this,size_t nCheapPrepend,size_t initialSize)

{
  size_type sVar1;
  size_t sVar2;
  allocator_type local_21;
  size_t local_20;
  size_t initialSize_local;
  size_t nCheapPrepend_local;
  Buffer *this_local;
  
  this->m_nCheapPrepend = nCheapPrepend;
  local_20 = initialSize;
  initialSize_local = nCheapPrepend;
  nCheapPrepend_local = (size_t)this;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (&this->m_buffer,nCheapPrepend + initialSize,&local_21);
  std::allocator<char>::~allocator(&local_21);
  this->m_readerIndex = initialSize_local;
  this->m_writerIndex = initialSize_local;
  sVar1 = std::vector<char,_std::allocator<char>_>::capacity(&this->m_buffer);
  this->m_wrapSize = sVar1 * 3 >> 2;
  if (local_20 == 0) {
    __assert_fail("initialSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                  ,0x31,"sznet::net::Buffer::Buffer(size_t, size_t)");
  }
  sVar2 = readableBytes(this);
  if (sVar2 != 0) {
    __assert_fail("readableBytes() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                  ,0x33,"sznet::net::Buffer::Buffer(size_t, size_t)");
  }
  sVar2 = writableBytes(this);
  if (sVar2 != local_20) {
    __assert_fail("writableBytes() == initialSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                  ,0x34,"sznet::net::Buffer::Buffer(size_t, size_t)");
  }
  sVar2 = prependableBytes(this);
  if (sVar2 != initialSize_local) {
    __assert_fail("prependableBytes() == nCheapPrepend",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                  ,0x35,"sznet::net::Buffer::Buffer(size_t, size_t)");
  }
  return;
}

Assistant:

explicit Buffer(size_t nCheapPrepend = kCheapPrepend, size_t initialSize = kInitialSize):
		m_nCheapPrepend(nCheapPrepend),
		m_buffer(nCheapPrepend + initialSize),
		m_readerIndex(nCheapPrepend),
		m_writerIndex(nCheapPrepend),
		m_wrapSize(m_buffer.capacity() * 3 / 4)
	{
		assert(initialSize > 0);
		assert(nCheapPrepend >= 0);
		assert(readableBytes() == 0);
		assert(writableBytes() == initialSize);
		assert(prependableBytes() == nCheapPrepend);
	}